

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O0

void __thiscall trackerboy::apu::Mixer::clear(Mixer *this)

{
  pointer __first;
  float local_34;
  iterator local_30;
  value_type *accum;
  iterator __end2;
  iterator __begin2;
  array<trackerboy::apu::Mixer::Accum,_2UL> *__range2;
  Mixer *this_local;
  
  this->mSampleOffset = 0.0;
  this->mWriteIndex = 0;
  __begin2 = (this->mAccumulators)._M_elems;
  __range2 = (array<trackerboy::apu::Mixer::Accum,_2UL> *)this;
  __end2 = std::array<trackerboy::apu::Mixer::Accum,_2UL>::begin
                     ((array<trackerboy::apu::Mixer::Accum,_2UL> *)__begin2);
  accum = std::array<trackerboy::apu::Mixer::Accum,_2UL>::end
                    ((array<trackerboy::apu::Mixer::Accum,_2UL> *)__begin2);
  for (; __end2 != accum; __end2 = __end2 + 1) {
    local_30 = __end2;
    Accum::reset(__end2);
  }
  __first = std::unique_ptr<float[],_std::default_delete<float[]>_>::get(&this->mBuffer);
  local_34 = 0.0;
  std::fill_n<float*,unsigned_long,float>(__first,this->mBuffersize,&local_34);
  return;
}

Assistant:

void Mixer::clear() {
    mSampleOffset = 0.0f;
    mWriteIndex = 0;
    for (auto &accum : mAccumulators) {
        accum.reset();
    }
    std::fill_n(mBuffer.get(), mBuffersize, 0.0f);
}